

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

Iterator __thiscall BPlusTree<int>::search(BPlusTree<int> *this,int *entry)

{
  int iVar1;
  int *piVar2;
  BPlusTree<int> **ppBVar3;
  size_t index;
  Iterator IVar4;
  
  iVar1 = b_array::first_ge<int>(&this->data,this->data_size,entry);
  index = (size_t)iVar1;
  IVar4.offset = index;
  IVar4.node_ptr = this;
  if ((index < this->data_size) &&
     (piVar2 = b_array::Array<int>::operator[](&this->data,index), *piVar2 == *entry)) {
    if (this->subset_size == 0) {
      return IVar4;
    }
    index = index + 1;
  }
  else if (this->subset_size == 0) {
    return (Iterator)ZEXT816(0);
  }
  ppBVar3 = b_array::Array<BPlusTree<int>_*>::operator[](&this->subset,index);
  IVar4 = search(*ppBVar3,entry);
  return IVar4;
}

Assistant:

typename BPlusTree<T>::Iterator BPlusTree<T>::search(const T& entry) const {
    size_t index = b_array::first_ge(data, data_size, entry);
    bool found = index < data_size && data[index] == entry;
    if (found && is_leaf())
        return Iterator((BPlusTree<T>*)this, index);
    else if (found && !is_leaf())
        return subset[index + 1]->search(entry);
    else if (!found && !is_leaf())
        return subset[index]->search(entry);
    else if (!found && is_leaf())
        return Iterator(nullptr);    
    return Iterator(nullptr);
}